

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O0

int Abc_CommandAbc9MuxProfile(Abc_Frame_t *pAbc,int argc,char **argv)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  uint local_38;
  uint local_34;
  int fVerbose;
  int nLimit;
  int fMuxes;
  int c;
  char **argv_local;
  int argc_local;
  Abc_Frame_t *pAbc_local;
  
  bVar1 = false;
  local_34 = 0;
  local_38 = 0;
  Extra_UtilGetoptReset();
  while( true ) {
    while( true ) {
      iVar2 = Extra_UtilGetopt(argc,argv,"Nmvh");
      if (iVar2 == -1) {
        if (pAbc->pGia == (Gia_Man_t *)0x0) {
          Abc_Print(-1,"Abc_CommandAbc9MuxProfile(): There is no AIG.\n");
          return 1;
        }
        if (bVar1) {
          Gia_ManMuxProfiling(pAbc->pGia);
        }
        else {
          Gia_ManProfileStructures(pAbc->pGia,local_34,local_38);
        }
        return 0;
      }
      if (iVar2 == 0x4e) break;
      if (iVar2 == 0x68) goto LAB_0025ab95;
      if (iVar2 == 0x6d) {
        bVar1 = (bool)(bVar1 ^ 1);
      }
      else {
        if (iVar2 != 0x76) goto LAB_0025ab95;
        local_38 = local_38 ^ 1;
      }
    }
    if (argc <= globalUtilOptind) break;
    local_34 = atoi(argv[globalUtilOptind]);
    globalUtilOptind = globalUtilOptind + 1;
    if ((int)local_34 < 0) {
LAB_0025ab95:
      Abc_Print(-2,"usage: &profile [-N num] [-mvh]\n");
      Abc_Print(-2,"\t         profile gate structures appearing in the AIG\n");
      Abc_Print(-2,"\t-N num : limit on class size to show [default = %d]\n",(ulong)local_34);
      pcVar3 = "no";
      if (bVar1) {
        pcVar3 = "yes";
      }
      Abc_Print(-2,"\t-m     : toggle profiling MUX structures [default = %s]\n",pcVar3);
      pcVar3 = "no";
      if (local_38 != 0) {
        pcVar3 = "yes";
      }
      Abc_Print(-2,"\t-v     : toggle verbose output [default = %s]\n",pcVar3);
      Abc_Print(-2,"\t-h     : print the command usage\n");
      return 1;
    }
  }
  Abc_Print(-1,"Command line switch \"-N\" should be followed by an integer.\n");
  goto LAB_0025ab95;
}

Assistant:

int Abc_CommandAbc9MuxProfile( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    extern void Gia_ManMuxProfiling( Gia_Man_t * p );
    extern void Gia_ManProfileStructures( Gia_Man_t * p, int nLimit, int fVerbose );
    int c, fMuxes = 0, nLimit = 0, fVerbose = 0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "Nmvh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'N':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-N\" should be followed by an integer.\n" );
                goto usage;
            }
            nLimit = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nLimit < 0 )
                goto usage;
            break;
        case 'm':
            fMuxes ^= 1;
            break;
        case 'v':
            fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( pAbc->pGia == NULL )
    {
        Abc_Print( -1, "Abc_CommandAbc9MuxProfile(): There is no AIG.\n" );
        return 1;
    }
    if ( fMuxes )
        Gia_ManMuxProfiling( pAbc->pGia );
    else
        Gia_ManProfileStructures( pAbc->pGia, nLimit, fVerbose );
    return 0;

usage:
    Abc_Print( -2, "usage: &profile [-N num] [-mvh]\n" );
    Abc_Print( -2, "\t         profile gate structures appearing in the AIG\n" );
    Abc_Print( -2, "\t-N num : limit on class size to show [default = %d]\n", nLimit );
    Abc_Print( -2, "\t-m     : toggle profiling MUX structures [default = %s]\n", fMuxes? "yes": "no" );
    Abc_Print( -2, "\t-v     : toggle verbose output [default = %s]\n", fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    return 1;
}